

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

char * lws_cmdline_option(int argc,char **argv,char *val)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  long lVar4;
  
  sVar2 = strlen(val);
  __n = (size_t)(int)sVar2;
  lVar4 = (ulong)(uint)argc + 1;
  do {
    if ((int)lVar4 + -1 < 2) goto LAB_0010f4c2;
    pcVar3 = argv[lVar4 + -2];
    iVar1 = strncmp(pcVar3,val,__n);
    lVar4 = lVar4 + -1;
  } while (iVar1 != 0);
  if (((int)(uint)lVar4 < argc) && (pcVar3[__n] == '\0')) {
    __s = argv[(uint)lVar4 & 0x7fffffff];
    if (__s == (char *)0x0) {
LAB_0010f4c2:
      pcVar3 = (char *)0x0;
    }
    else {
      sVar2 = strlen(__s);
      pcVar3 = (char *)0x0;
      if (sVar2 < 0x401) {
        pcVar3 = __s;
      }
    }
  }
  else if (pcVar3[__n] == '=') {
    pcVar3 = pcVar3 + ((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
  }
  else {
    pcVar3 = pcVar3 + __n;
  }
  return pcVar3;
}

Assistant:

const char *
lws_cmdline_option(int argc, const char **argv, const char *val)
{
	int n = (int)strlen(val), c = argc;

	while (--c > 0) {

		if (!strncmp(argv[c], val, n)) {
			if (!*(argv[c] + n) && c < argc - 1) {
				/* coverity treats unchecked argv as "tainted" */
				if (!argv[c + 1] || strlen(argv[c + 1]) > 1024)
					return NULL;
				return argv[c + 1];
			}

			if (argv[c][n] == '=')
				return &argv[c][n + 1];
			return argv[c] + n;
		}
	}

	return NULL;
}